

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.hpp
# Opt level: O2

void __thiscall katherine::device::device(device *this,string *addr)

{
  int rc;
  system_error *this_00;
  
  this->_vptr_device = (_func_int **)&PTR__device_00106c98;
  rc = katherine_device_init(&this->dev_,(addr->_M_dataplus)._M_p);
  if (rc == 0) {
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x10);
  system_error::system_error(this_00,rc);
  __cxa_throw(this_00,&system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

device(std::string addr)
    {
        int res = katherine_device_init(&dev_, addr.c_str());
        if (res != 0) {
            throw katherine::system_error{res};
        }
    }